

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaB_assert(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  
  luaL_checkany(L,1);
  iVar1 = lua_toboolean(L,1);
  if (iVar1 != 0) {
    return (int)((ulong)((long)L->top - (long)L->base) >> 4);
  }
  pcVar2 = luaL_optlstring(L,2,"assertion failed!",(size_t *)0x0);
  luaL_error(L,"%s",pcVar2);
}

Assistant:

static int luaB_assert(lua_State*L){
luaL_checkany(L,1);
if(!lua_toboolean(L,1))
return luaL_error(L,"%s",luaL_optstring(L,2,"assertion failed!"));
return lua_gettop(L);
}